

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  StringEntry *pSVar1;
  void *pvVar2;
  bool bVar3;
  StringEntry *__tmp;
  StringEntry *pSVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  unsigned_long *puVar10;
  pointer ppVar11;
  pointer ppVar12;
  byte bVar13;
  undefined8 unaff_R13;
  char cVar14;
  long lVar15;
  ulong uVar16;
  DynamicEntryList dentries;
  StringEntry *se [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  pointer local_2c8;
  pointer local_2c0;
  uint local_2b4;
  unsigned_long local_2a8;
  DynamicEntryList local_2a0;
  StringEntry *local_288 [3];
  string *local_270;
  unsigned_long local_268 [4];
  vector<char,_std::allocator<char>_> local_248;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  bVar3 = cmELF::Valid((cmELF *)local_230);
  local_270 = file;
  if (bVar3) {
    local_288[0] = (StringEntry *)0x0;
    local_288[1] = (StringEntry *)0x0;
    pSVar4 = cmELF::GetRPath((cmELF *)local_230);
    bVar3 = pSVar4 != (StringEntry *)0x0;
    if (bVar3) {
      local_288[0] = pSVar4;
    }
    pSVar4 = cmELF::GetRunPath((cmELF *)local_230);
    local_2a8 = (ulong)bVar3;
    if (pSVar4 != (StringEntry *)0x0) {
      local_2a8 = (unsigned_long)(bVar3 + 1);
      local_288[bVar3] = pSVar4;
    }
    pSVar4 = local_288[0];
    local_2b4 = (uint)local_2a8;
    if (local_2b4 == 0) {
      bVar13 = 1;
      local_2c0 = (pointer)0x0;
      local_2c8 = (pointer)0x0;
      cVar14 = '\0';
    }
    else {
      if ((local_2b4 == 2) && (local_288[1]->IndexInSection < local_288[0]->IndexInSection)) {
        local_288[0] = local_288[1];
        local_288[1] = pSVar4;
      }
      cmELF::GetDynamicEntries(&local_2a0,(cmELF *)local_230);
      bVar3 = (pointer)CONCAT71(local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
              local_2a0.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      pSVar4 = (StringEntry *)CONCAT71((int7)((ulong)unaff_R13 >> 8),!bVar3);
      if (bVar3) {
        if (emsg == (string *)0x0) {
          local_2c0 = (pointer)0x0;
          local_2c8 = (pointer)0x0;
          local_2a8 = 0;
          local_2b4 = 0;
        }
        else {
          local_2c0 = (pointer)0x0;
          std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x8b5a98);
          local_2c8 = (pointer)0x0;
          local_2a8 = 0;
          local_2b4 = 0;
        }
      }
      else {
        if (local_2b4 != 0) {
          uVar5 = 0;
          do {
            pSVar1 = local_288[uVar5];
            local_268[uVar5 + 2] = pSVar1->Position;
            local_268[uVar5] = pSVar1->Size;
            uVar5 = uVar5 + 1;
          } while (local_2a8 != uVar5);
        }
        local_288[2] = pSVar4;
        uVar5 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,1);
        uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
        ppVar12 = (pointer)CONCAT71(local_2a0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_2a0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if (ppVar12 !=
            local_2a0.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar15 = 0;
          do {
            lVar7 = ppVar12->first;
            if (lVar7 != 0x1d && lVar7 != 0xf) {
              ppVar11 = ppVar12;
              do {
                ppVar12 = ppVar11 + 1;
                if ((lVar7 == 0x70000035) && (bVar3 = cmELF::IsMIPS((cmELF *)local_230), bVar3)) {
                  ppVar11->second = ppVar11->second + lVar15 * (uVar5 - uVar6);
                }
                if (ppVar12 ==
                    local_2a0.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00349183;
                lVar7 = ppVar12->first;
              } while ((lVar7 != 0xf) && (ppVar11 = ppVar12, lVar7 != 0x1d));
            }
            if ((ppVar12 + 1 !=
                 local_2a0.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (lVar7 = (long)local_2a0.
                              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)(ppVar12 + 1) >> 4,
               0 < lVar7)) {
              lVar7 = lVar7 + 1;
              puVar10 = &ppVar12[1].second;
              do {
                puVar10[-3] = ((pair<long,_unsigned_long> *)(puVar10 + -1))->first;
                puVar10[-2] = *puVar10;
                lVar7 = lVar7 + -1;
                puVar10 = puVar10 + 2;
              } while (1 < lVar7);
            }
            local_2a0.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_2a0.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            lVar15 = lVar15 + 1;
          } while (ppVar12 !=
                   local_2a0.
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
LAB_00349183:
        cmELF::EncodeDynamicEntries(&local_248,(cmELF *)local_230,&local_2a0);
        local_2c8 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_2a8 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
        local_2c0 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        pSVar4 = local_288[2];
      }
      cVar14 = (char)pSVar4;
      pvVar2 = (void *)CONCAT71(local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_2a0.
                                     super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      bVar13 = 0;
    }
    bVar3 = true;
  }
  else {
    local_2c0 = (pointer)0x0;
    local_2c8 = (pointer)0x0;
    bVar13 = 0;
    bVar3 = false;
    cVar14 = '\0';
    local_2a8 = 0;
    local_2b4 = 0;
  }
  cmELF::~cmELF((cmELF *)local_230);
  if (cVar14 == '\0') goto LAB_0034947f;
  std::ofstream::ofstream(local_230,(local_270->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if ((abStack_210
       [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left] & 5) == 0) {
    plVar8 = (long *)std::ostream::seekp(local_230,local_2a8,0);
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
      plVar8 = (long *)std::ostream::write(local_230,(long)local_2c8);
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
        if (local_2b4 != 0) {
          uVar16 = 0;
          do {
            plVar8 = (long *)std::ostream::seekp((ostream *)local_230,local_268[uVar16 + 2],0);
            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
              if (emsg == (string *)0x0) {
LAB_003494d4:
                bVar13 = 0;
                goto LAB_00349442;
              }
              pcVar9 = "Error seeking to RPATH position.";
LAB_00349435:
              std::__cxx11::string::operator=((string *)emsg,pcVar9);
              goto LAB_0034943f;
            }
            for (uVar5 = local_268[uVar16]; uVar5 != 0; uVar5 = uVar5 - 1) {
              local_2a0.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_230,(char *)&local_2a0,1);
            }
            if ((abStack_210[(long)*(_Base_ptr *)(local_230._0_8_ + -0x18)] & 5) != 0) {
              if (emsg == (string *)0x0) goto LAB_003494d4;
              pcVar9 = "Error writing the empty rpath string to the file.";
              goto LAB_00349435;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != local_2b4);
        }
        bVar13 = 1;
        if (removed != (bool *)0x0) {
          *removed = true;
        }
        goto LAB_00349442;
      }
      if (emsg == (string *)0x0) goto LAB_0034943f;
      pcVar9 = "Error replacing DYNAMIC table header.";
    }
    else {
      if (emsg == (string *)0x0) goto LAB_0034943f;
      pcVar9 = "Error seeking to DYNAMIC table header for RPATH.";
    }
LAB_00349361:
    bVar13 = 0;
    std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar9);
  }
  else {
    if (emsg != (string *)0x0) {
      pcVar9 = "Error opening file for update.";
      goto LAB_00349361;
    }
LAB_0034943f:
    bVar13 = 0;
  }
LAB_00349442:
  local_230._0_8_ = _VTT;
  *(undefined8 *)
   (local_230 +
   (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left) =
       _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  bVar3 = true;
LAB_0034947f:
  if (local_2c8 != (pointer)0x0) {
    operator_delete(local_2c8,(long)local_2c0 - (long)local_2c8);
  }
  if (bVar3 || removed == (bool *)0x0) {
    bVar3 = (bool)(!bVar3 | bVar13);
  }
  else {
    *removed = false;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (cm::optional<bool> result = RemoveRPathELF(file, emsg, removed)) {
    return result.value();
  }
  if (cm::optional<bool> result = RemoveRPathXCOFF(file, emsg, removed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  return true;
}